

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hostkey_hash.c
# Opt level: O2

int test(LIBSSH2_SESSION *session)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  size_t in_RCX;
  char *__format;
  int type;
  size_t len;
  char buf [8192];
  
  lVar2 = libssh2_session_hostkey(session,&len,&type);
  if (lVar2 == 0) {
    pcVar3 = "libssh2_session_hostkey";
LAB_00102500:
    print_last_session_error(pcVar3);
    return 1;
  }
  if (type == 1) {
    pcVar3 = (char *)libssh2_hostkey_hash(session,1);
    if (pcVar3 != (char *)0x0) {
      calculate_digest(pcVar3,0x10,buf,in_RCX);
      iVar1 = bcmp(buf,"0C0ED1A5BB10275F76924CE187CE5C5E",0x21);
      if (iVar1 != 0) {
        __format = "MD5 hash not as expected - digest %s != %s\n";
        pcVar3 = "0C0ED1A5BB10275F76924CE187CE5C5E";
        goto LAB_00102786;
      }
      pcVar3 = (char *)libssh2_hostkey_hash(session,2);
      if (pcVar3 == (char *)0x0) {
LAB_001026b9:
        pcVar3 = "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA1)";
        goto LAB_001026d5;
      }
      calculate_digest(pcVar3,0x14,buf,in_RCX);
      iVar1 = bcmp(buf,"F3CD59E2913F4422B80F7B0A82B2B89EAE449387",0x29);
      if (iVar1 != 0) {
        __format = "SHA1 hash not as expected - digest %s != %s\n";
        pcVar3 = "F3CD59E2913F4422B80F7B0A82B2B89EAE449387";
LAB_00102786:
        fprintf(_stderr,__format,buf,pcVar3);
        return 1;
      }
      pcVar3 = (char *)libssh2_hostkey_hash(session,3);
      if (pcVar3 != (char *)0x0) {
        calculate_digest(pcVar3,0x20,buf,in_RCX);
        iVar1 = bcmp(buf,"92E3DA49DF3C7F99A828F505ED8239397A5D1F62914459760F878F7510F563A3",0x41);
        if (iVar1 == 0) {
          return 0;
        }
        __format = "SHA256 hash not as expected - digest %s != %s\n";
        pcVar3 = "92E3DA49DF3C7F99A828F505ED8239397A5D1F62914459760F878F7510F563A3";
        goto LAB_00102786;
      }
LAB_001026ce:
      pcVar3 = "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA256)";
      goto LAB_001026d5;
    }
  }
  else {
    if (type != 3) {
      if (type != 6) {
        fprintf(_stderr,"Unexpected type of hostkey: %i\n");
        return 1;
      }
      pcVar3 = (char *)libssh2_hostkey_hash(session,3);
      if (pcVar3 != (char *)0x0) {
        calculate_digest(pcVar3,0x20,buf,in_RCX);
        iVar1 = bcmp(buf,"2638B020F6121FA750A7F4754B718419F621814C6E779D68ADF26AA68814ADDF",0x41);
        if (iVar1 != 0) {
          fprintf(_stderr,"ED25519 SHA256 hash not as expected - digest %s != %s\n",buf,
                  "2638B020F6121FA750A7F4754B718419F621814C6E779D68ADF26AA68814ADDF");
          return 1;
        }
        return 0;
      }
      pcVar3 = "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA256)";
      goto LAB_00102500;
    }
    pcVar3 = (char *)libssh2_hostkey_hash(session,1);
    if (pcVar3 != (char *)0x0) {
      calculate_digest(pcVar3,0x10,buf,in_RCX);
      iVar1 = bcmp(buf,"0402E4D897580BBC911379CBD88BCD3D",0x21);
      if (iVar1 != 0) {
        __format = "ECDSA MD5 hash not as expected - digest %s != %s\n";
        pcVar3 = "0402E4D897580BBC911379CBD88BCD3D";
        goto LAB_00102786;
      }
      pcVar3 = (char *)libssh2_hostkey_hash(session,2);
      if (pcVar3 == (char *)0x0) goto LAB_001026b9;
      calculate_digest(pcVar3,0x14,buf,in_RCX);
      iVar1 = bcmp(buf,"12FDAD1E3B31B10BABB00F2A8D1B9A62C326BD2F",0x29);
      if (iVar1 != 0) {
        __format = "ECDSA SHA1 hash not as expected - digest %s != %s\n";
        pcVar3 = "12FDAD1E3B31B10BABB00F2A8D1B9A62C326BD2F";
        goto LAB_00102786;
      }
      pcVar3 = (char *)libssh2_hostkey_hash(session,3);
      if (pcVar3 != (char *)0x0) {
        calculate_digest(pcVar3,0x20,buf,in_RCX);
        iVar1 = bcmp(buf,"56FCD975B166C3F0342D0036E44C311A86C0EAE40713B53FC776369BAE7F5264",0x41);
        if (iVar1 == 0) {
          return 0;
        }
        __format = "ECDSA SHA256 hash not as expected - digest %s != %s\n";
        pcVar3 = "56FCD975B166C3F0342D0036E44C311A86C0EAE40713B53FC776369BAE7F5264";
        goto LAB_00102786;
      }
      goto LAB_001026ce;
    }
  }
  pcVar3 = "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_MD5)";
LAB_001026d5:
  print_last_session_error(pcVar3);
  return 1;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
    char buf[BUFSIZ];

    const char *hostkey;
    const char *md5_hash;
    const char *sha1_hash;
    const char *sha256_hash;
    int type;
    size_t len;

    /* these are the host keys under test, they are currently unused */
    (void)EXPECTED_RSA_HOSTKEY;
    (void)EXPECTED_ECDSA_HOSTKEY;
    (void)EXPECTED_ED25519_HOSTKEY;

    hostkey = libssh2_session_hostkey(session, &len, &type);
    if(!hostkey) {
        print_last_session_error("libssh2_session_hostkey");
        return 1;
    }

    if(type == LIBSSH2_HOSTKEY_TYPE_ED25519) {

        sha256_hash = libssh2_hostkey_hash(session,
                                           LIBSSH2_HOSTKEY_HASH_SHA256);
        if(!sha256_hash) {
            print_last_session_error(
                "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA256)");
            return 1;
        }

        calculate_digest(sha256_hash, SHA256_HASH_SIZE, buf, BUFSIZ);

        if(strcmp(buf, EXPECTED_ED25519_SHA256_HASH_DIGEST) != 0) {
            fprintf(stderr,
                    "ED25519 SHA256 hash not as expected - digest %s != %s\n",
                    buf, EXPECTED_ED25519_SHA256_HASH_DIGEST);
            return 1;
        }
    }
    else if(type == LIBSSH2_HOSTKEY_TYPE_ECDSA_256) {

        md5_hash = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_MD5);
        if(!md5_hash) {
            print_last_session_error(
                "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_MD5)");
            return 1;
        }

        calculate_digest(md5_hash, MD5_HASH_SIZE, buf, BUFSIZ);

        if(strcmp(buf, EXPECTED_ECDSA_MD5_HASH_DIGEST) != 0) {
            fprintf(stderr,
                    "ECDSA MD5 hash not as expected - digest %s != %s\n",
                    buf, EXPECTED_ECDSA_MD5_HASH_DIGEST);
            return 1;
        }

        sha1_hash = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
        if(!sha1_hash) {
            print_last_session_error(
                "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA1)");
            return 1;
        }

        calculate_digest(sha1_hash, SHA1_HASH_SIZE, buf, BUFSIZ);

        if(strcmp(buf, EXPECTED_ECDSA_SHA1_HASH_DIGEST) != 0) {
            fprintf(stderr,
                    "ECDSA SHA1 hash not as expected - digest %s != %s\n",
                    buf, EXPECTED_ECDSA_SHA1_HASH_DIGEST);
            return 1;
        }

        sha256_hash = libssh2_hostkey_hash(session,
                                           LIBSSH2_HOSTKEY_HASH_SHA256);
        if(!sha256_hash) {
            print_last_session_error(
                "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA256)");
            return 1;
        }

        calculate_digest(sha256_hash, SHA256_HASH_SIZE, buf, BUFSIZ);

        if(strcmp(buf, EXPECTED_ECDSA_SHA256_HASH_DIGEST) != 0) {
            fprintf(stderr,
                    "ECDSA SHA256 hash not as expected - digest %s != %s\n",
                    buf, EXPECTED_ECDSA_SHA256_HASH_DIGEST);
            return 1;
        }
    }
    else if(type == LIBSSH2_HOSTKEY_TYPE_RSA) {

        md5_hash = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_MD5);
        if(!md5_hash) {
            print_last_session_error(
                "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_MD5)");
            return 1;
        }

        calculate_digest(md5_hash, MD5_HASH_SIZE, buf, BUFSIZ);

        if(strcmp(buf, EXPECTED_RSA_MD5_HASH_DIGEST) != 0) {
            fprintf(stderr,
                    "MD5 hash not as expected - digest %s != %s\n",
                    buf, EXPECTED_RSA_MD5_HASH_DIGEST);
            return 1;
        }

        sha1_hash = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
        if(!sha1_hash) {
            print_last_session_error(
                "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA1)");
            return 1;
        }

        calculate_digest(sha1_hash, SHA1_HASH_SIZE, buf, BUFSIZ);

        if(strcmp(buf, EXPECTED_RSA_SHA1_HASH_DIGEST) != 0) {
            fprintf(stderr,
                    "SHA1 hash not as expected - digest %s != %s\n",
                    buf, EXPECTED_RSA_SHA1_HASH_DIGEST);
            return 1;
        }

        sha256_hash = libssh2_hostkey_hash(session,
                                           LIBSSH2_HOSTKEY_HASH_SHA256);
        if(!sha256_hash) {
            print_last_session_error(
                "libssh2_hostkey_hash(LIBSSH2_HOSTKEY_HASH_SHA256)");
            return 1;
        }

        calculate_digest(sha256_hash, SHA256_HASH_SIZE, buf, BUFSIZ);

        if(strcmp(buf, EXPECTED_RSA_SHA256_HASH_DIGEST) != 0) {
            fprintf(stderr,
                    "SHA256 hash not as expected - digest %s != %s\n",
                    buf, EXPECTED_RSA_SHA256_HASH_DIGEST);
            return 1;
        }
    }
    else {
        fprintf(stderr, "Unexpected type of hostkey: %i\n", type);
        return 1;
    }

    return 0;
}